

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_write_uvector(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp writer,sexp out)

{
  uchar uVar1;
  long lVar2;
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  int iVar3;
  long in_RCX;
  sexp in_RDI;
  long in_R9;
  double dVar4;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp f;
  char *str;
  sexp_uint_t len;
  sexp_uint_t i;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  unsigned_short in_stack_ffffffffffffff0e;
  sexp in_stack_ffffffffffffff10;
  sexp in_stack_ffffffffffffff18;
  sexp_gc_var_t local_78;
  sexp local_68;
  sexp_gc_var_t local_60;
  sexp local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  long local_30;
  long local_20;
  sexp local_8;
  
  local_50 = (sexp)0x43e;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_8 = in_RDI;
  memset(&local_60,0,0x10);
  local_68 = (sexp)&DAT_0000043e;
  memset(&local_78,0,0x10);
  local_60.var = &local_50;
  local_60.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_60;
  local_78.var = &local_68;
  local_78.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_78;
  local_50 = sexp_make_flonum((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                                             CONCAT24(in_stack_ffffffffffffff0c,
                                                      in_stack_ffffffffffffff08)),
                              (double)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
  ;
  if (*(long *)(local_30 + 0x28) == 0) {
    putc(0x23,*(FILE **)(local_30 + 0x20));
  }
  else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
    lVar2 = *(long *)(local_30 + 0x38);
    *(long *)(local_30 + 0x38) = lVar2 + 1;
    *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x23;
  }
  else {
    sexp_buffered_write_char
              ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                              CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
               in_stack_ffffffffffffff04,
               (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  if (*(long *)(local_30 + 0x28) == 0) {
    putc((uint)"#ususususuffccff"[*(byte *)(local_20 + 0x10)],*(FILE **)(local_30 + 0x20));
  }
  else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
    uVar1 = "#ususususuffccff"[*(byte *)(local_20 + 0x10)];
    lVar2 = *(long *)(local_30 + 0x38);
    *(long *)(local_30 + 0x38) = lVar2 + 1;
    *(uchar *)(*(long *)(local_30 + 0x28) + lVar2) = uVar1;
  }
  else {
    sexp_buffered_write_char
              ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                              CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
               in_stack_ffffffffffffff04,
               (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (*(long *)(local_30 + 0x28) == 0) {
    putc(0x28,*(FILE **)(local_30 + 0x20));
  }
  else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
    lVar2 = *(long *)(local_30 + 0x38);
    *(long *)(local_30 + 0x38) = lVar2 + 1;
    *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x28;
  }
  else {
    sexp_buffered_write_char
              ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                              CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
               in_stack_ffffffffffffff04,
               (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  local_40 = *(ulong *)(local_20 + 0x18);
  local_48 = *(long *)(local_20 + 8) + 0x10;
  for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
    if (local_38 != 0) {
      if (*(long *)(local_30 + 0x28) == 0) {
        putc(0x20,*(FILE **)(local_30 + 0x20));
      }
      else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
        lVar2 = *(long *)(local_30 + 0x38);
        *(long *)(local_30 + 0x38) = lVar2 + 1;
        *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x20;
      }
      else {
        sexp_buffered_write_char
                  ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                                  CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                   in_stack_ffffffffffffff04,
                   (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
    }
    switch(*(undefined1 *)(local_20 + 0x10)) {
    case 1:
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 2:
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 4:
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 5:
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 6:
      x._4_4_ = in_stack_ffffffffffffff04;
      x._0_4_ = in_stack_ffffffffffffff00;
      x._8_4_ = in_stack_ffffffffffffff08;
      x._12_2_ = in_stack_ffffffffffffff0c;
      x._14_2_ = in_stack_ffffffffffffff0e;
      local_68 = sexp_make_integer(in_stack_ffffffffffffff18,(sexp_lsint_t)x);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 7:
      x_00._4_4_ = in_stack_ffffffffffffff04;
      x_00._0_4_ = in_stack_ffffffffffffff00;
      x_00._8_4_ = in_stack_ffffffffffffff08;
      x_00._12_2_ = in_stack_ffffffffffffff0c;
      x_00._14_2_ = in_stack_ffffffffffffff0e;
      local_68 = sexp_make_unsigned_integer(in_stack_ffffffffffffff18,(sexp_luint_t)x_00);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 8:
      x_01._4_4_ = in_stack_ffffffffffffff04;
      x_01._0_4_ = in_stack_ffffffffffffff00;
      x_01._8_4_ = in_stack_ffffffffffffff08;
      x_01._12_2_ = in_stack_ffffffffffffff0c;
      x_01._14_2_ = in_stack_ffffffffffffff0e;
      in_stack_ffffffffffffff18 = local_8;
      local_68 = sexp_make_integer(local_8,(sexp_lsint_t)x_01);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 9:
      x_02._4_4_ = in_stack_ffffffffffffff04;
      x_02._0_4_ = in_stack_ffffffffffffff00;
      x_02._8_4_ = in_stack_ffffffffffffff08;
      x_02._12_2_ = in_stack_ffffffffffffff0c;
      x_02._14_2_ = in_stack_ffffffffffffff0e;
      in_stack_ffffffffffffff10 = local_8;
      local_68 = sexp_make_unsigned_integer(in_stack_ffffffffffffff18,(sexp_luint_t)x_02);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 10:
      (local_50->value).flonum = (double)*(float *)(local_48 + local_38 * 4);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 0xb:
      (local_50->value).flonum = *(double *)(local_48 + local_38 * 8);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 0xc:
      (local_50->value).flonum = (double)*(float *)(local_48 + local_38 * 8);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (0.0 <= *(float *)(local_48 + 4 + local_38 * 8)) {
        if (*(long *)(local_30 + 0x28) == 0) {
          putc(0x2b,*(FILE **)(local_30 + 0x20));
        }
        else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
          lVar2 = *(long *)(local_30 + 0x38);
          *(long *)(local_30 + 0x38) = lVar2 + 1;
          *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x2b;
          in_stack_ffffffffffffff0c = 0;
          in_stack_ffffffffffffff0e = 0;
        }
        else {
          iVar3 = sexp_buffered_write_char
                            ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                                            CONCAT24(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08)),
                             in_stack_ffffffffffffff04,
                             (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          in_stack_ffffffffffffff0c = (undefined2)iVar3;
          in_stack_ffffffffffffff0e = (unsigned_short)((uint)iVar3 >> 0x10);
        }
      }
      (local_50->value).flonum = (double)*(float *)(local_48 + 4 + local_38 * 8);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (*(long *)(local_30 + 0x28) == 0) {
        putc(0x69,*(FILE **)(local_30 + 0x20));
      }
      else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
        lVar2 = *(long *)(local_30 + 0x38);
        *(long *)(local_30 + 0x38) = lVar2 + 1;
        *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x69;
        in_stack_ffffffffffffff08 = 0;
      }
      else {
        in_stack_ffffffffffffff08 =
             sexp_buffered_write_char
                       ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                                       CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                                      ),in_stack_ffffffffffffff04,
                        (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
      break;
    case 0xd:
      (local_50->value).flonum = *(double *)(local_48 + local_38 * 0x10);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (0.0 <= *(double *)(local_48 + 8 + local_38 * 0x10)) {
        if (*(long *)(local_30 + 0x28) == 0) {
          putc(0x2b,*(FILE **)(local_30 + 0x20));
        }
        else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
          lVar2 = *(long *)(local_30 + 0x38);
          *(long *)(local_30 + 0x38) = lVar2 + 1;
          *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x2b;
          in_stack_ffffffffffffff04 = 0;
        }
        else {
          in_stack_ffffffffffffff04 =
               sexp_buffered_write_char
                         ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                                         CONCAT24(in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08)),
                          in_stack_ffffffffffffff04,
                          (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        }
      }
      (local_50->value).flonum = *(double *)(local_48 + 8 + local_38 * 0x10);
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (*(long *)(local_30 + 0x28) == 0) {
        putc(0x69,*(FILE **)(local_30 + 0x20));
      }
      else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
        lVar2 = *(long *)(local_30 + 0x38);
        *(long *)(local_30 + 0x38) = lVar2 + 1;
        *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x69;
        in_stack_ffffffffffffff00 = 0;
      }
      else {
        in_stack_ffffffffffffff00 =
             sexp_buffered_write_char
                       ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                                       CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                                      ),in_stack_ffffffffffffff04,
                        (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
      break;
    case 0xe:
      dVar4 = sexp_quarter_to_double(*(uchar *)(local_48 + local_38));
      (local_50->value).flonum = dVar4;
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case 0xf:
      dVar4 = sexp_half_to_double(in_stack_ffffffffffffff0e);
      (local_50->value).flonum = dVar4;
      sexp_write_op(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    CONCAT26(in_stack_ffffffffffffff0e,
                             CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
                    (sexp)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
  }
  if (*(long *)(local_30 + 0x28) == 0) {
    putc(0x29,*(FILE **)(local_30 + 0x20));
  }
  else if (*(ulong *)(local_30 + 0x38) < *(ulong *)(local_30 + 0x50)) {
    lVar2 = *(long *)(local_30 + 0x38);
    *(long *)(local_30 + 0x38) = lVar2 + 1;
    *(undefined1 *)(*(long *)(local_30 + 0x28) + lVar2) = 0x29;
  }
  else {
    sexp_buffered_write_char
              ((sexp)CONCAT26(in_stack_ffffffffffffff0e,
                              CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
               in_stack_ffffffffffffff04,
               (sexp)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  (local_8->value).context.saves = local_60.next;
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_write_uvector(sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp writer, sexp out) {
  sexp_uint_t i, len;
  char* str;
  sexp_gc_var2(f, tmp);
  sexp_gc_preserve2(ctx, f, tmp);
  f = sexp_make_flonum(ctx, 0.0f);
  sexp_write_char(ctx, '#', out);
  sexp_write_char(ctx, sexp_uvector_prefix(sexp_uvector_type(obj)), out);
  sexp_write(ctx, sexp_make_fixnum(sexp_uvector_element_size(sexp_uvector_type(obj))), out);
  sexp_write_char(ctx, '(', out);
  len = sexp_uvector_length(obj);
  str = (char*) sexp_uvector_data(obj);
  for (i=0; i<(sexp_sint_t)len; i++) {
    if (i!=0) sexp_write_char(ctx, ' ', out);
    switch (sexp_uvector_type(obj)) {
    case SEXP_U1: sexp_write(ctx, sexp_make_fixnum(sexp_bit_ref(obj, i)), out); break;
    case SEXP_S8: sexp_write(ctx, sexp_make_fixnum(((signed char*)str)[i]), out); break;
    case SEXP_S16: sexp_write(ctx, sexp_make_fixnum(((signed short*)str)[i]), out); break;
    case SEXP_U16: sexp_write(ctx, sexp_make_fixnum(((unsigned short*)str)[i]), out); break;
    case SEXP_S32: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int32_t*)str)[i]), out); break;
    case SEXP_U32: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint32_t*)str)[i]), out); break;
    case SEXP_S64: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int64_t*)str)[i]), out); break;
    case SEXP_U64: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint64_t*)str)[i]), out); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
    case SEXP_F8: sexp_flonum_value_set(f, sexp_quarter_to_double(((unsigned char*)str)[i])); sexp_write(ctx, f, out); break;
    case SEXP_F16: sexp_flonum_value_set(f, sexp_half_to_double(((unsigned short*)str)[i])); sexp_write(ctx, f, out); break;
#endif
    case SEXP_F32: sexp_flonum_value_set(f, ((float*)str)[i]); sexp_write(ctx, f, out); break;
    case SEXP_F64: sexp_flonum_value_set(f, ((double*)str)[i]); sexp_write(ctx, f, out); break;
#endif
#if SEXP_USE_COMPLEX
    case SEXP_C64:
      sexp_flonum_value_set(f, ((float*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((float*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((float*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
    case SEXP_C128:
      sexp_flonum_value_set(f, ((double*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((double*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((double*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
#endif
    }
  }
  sexp_write_char(ctx, ')', out);
  sexp_gc_release2(ctx);
  return SEXP_VOID;
}